

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int hd_inflate_commit_indname(nghttp2_hd_inflater *inflater,nghttp2_hd_nv *nv_out)

{
  nghttp2_hd_nv local_58;
  int local_3c;
  undefined1 auStack_38 [4];
  int rv;
  nghttp2_hd_nv nv;
  nghttp2_hd_nv *nv_out_local;
  nghttp2_hd_inflater *inflater_local;
  
  nv._16_8_ = nv_out;
  nghttp2_hd_table_get(&local_58,&inflater->ctx,inflater->index);
  _auStack_38 = local_58.name;
  nv.name = local_58.value;
  nv.value._5_3_ = local_58._21_3_;
  nv.value._0_4_ = local_58.token;
  if (inflater->no_index == '\0') {
    nv.value._4_1_ = 0;
  }
  else {
    nv.value._4_1_ = 1;
  }
  nghttp2_rcbuf_incref(local_58.name);
  nv.name = inflater->valuercbuf;
  if (inflater->index_required != '\0') {
    local_3c = add_hd_table_incremental
                         (&inflater->ctx,(nghttp2_hd_nv *)auStack_38,(nghttp2_hd_map *)0x0,0);
    if (local_3c != 0) {
      nghttp2_rcbuf_decref(_auStack_38);
      return -0x385;
    }
    local_3c = 0;
  }
  emit_header((nghttp2_hd_nv *)nv._16_8_,(nghttp2_hd_nv *)auStack_38);
  inflater->nv_name_keep = _auStack_38;
  inflater->nv_value_keep = nv.name;
  inflater->valuercbuf = (nghttp2_rcbuf *)0x0;
  return 0;
}

Assistant:

static int hd_inflate_commit_indname(nghttp2_hd_inflater *inflater,
                                     nghttp2_hd_nv *nv_out) {
  nghttp2_hd_nv nv;
  int rv;

  nv = nghttp2_hd_table_get(&inflater->ctx, inflater->index);

  if (inflater->no_index) {
    nv.flags = NGHTTP2_NV_FLAG_NO_INDEX;
  } else {
    nv.flags = NGHTTP2_NV_FLAG_NONE;
  }

  nghttp2_rcbuf_incref(nv.name);

  nv.value = inflater->valuercbuf;

  if (inflater->index_required) {
    rv = add_hd_table_incremental(&inflater->ctx, &nv, NULL, 0);
    if (rv != 0) {
      nghttp2_rcbuf_decref(nv.name);
      return NGHTTP2_ERR_NOMEM;
    }
  }

  emit_header(nv_out, &nv);

  inflater->nv_name_keep = nv.name;
  inflater->nv_value_keep = nv.value;

  inflater->valuercbuf = NULL;

  return 0;
}